

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_identity_with_vector(void)

{
  int iVar1;
  undefined1 local_50 [8];
  vector2 expectedPosition;
  vector2 startingPosition;
  matrix2 m;
  
  expectedPosition.field_0.v[1] = 4.300000190734863;
  startingPosition.field_0.v[0] = 1.399999976158142;
  local_50 = (undefined1  [8])0x4011333340000000;
  expectedPosition.field_0.v[0] = 1.399999976158142;
  matrix2_identity((matrix2 *)((long)&startingPosition.field_0 + 8));
  vector2_multiplym2((vector2 *)((long)&expectedPosition.field_0 + 8),
                     (matrix2 *)((long)&startingPosition.field_0 + 8));
  iVar1 = vector2_equals((vector2 *)((long)&expectedPosition.field_0 + 8),(vector2 *)local_50);
  if (iVar1 == 0) {
    m.field_0.m[3] = (double)anon_var_dwarf_41c;
  }
  else {
    m.field_0.m[3] = 0.0;
  }
  return (char *)m.field_0.m[3];
}

Assistant:

static char *test_matrix2_identity_with_vector(void)
{
	/* vector * identity_matrix = vector */
	struct matrix2 m;
	struct vector2 startingPosition = {4.3f, 1.4f};
	struct vector2 expectedPosition = {4.3f, 1.4f};

	matrix2_identity(&m);

	vector2_multiplym2(&startingPosition, &m);
	test_assert(vector2_equals(&startingPosition, &expectedPosition));

	return NULL;
}